

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O2

float __thiscall GuillotineBinPack::Occupancy(GuillotineBinPack *this)

{
  Rect *pRVar1;
  ulong uVar2;
  long lVar3;
  
  pRVar1 = (this->usedRectangles).Array;
  uVar2 = 0;
  for (lVar3 = 0; (ulong)(this->usedRectangles).Count << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    uVar2 = uVar2 + (long)*(int *)((long)&pRVar1->height + lVar3) *
                    (long)*(int *)((long)&pRVar1->width + lVar3);
  }
  return (float)uVar2 / (float)(this->binHeight * this->binWidth);
}

Assistant:

float GuillotineBinPack::Occupancy() const
{
	///\todo The occupancy rate could be cached/tracked incrementally instead
	///      of looping through the list of packed rectangles here.
	unsigned long usedSurfaceArea = 0;
	for(unsigned i = 0; i < usedRectangles.Size(); ++i)
		usedSurfaceArea += usedRectangles[i].width * usedRectangles[i].height;

	return (float)usedSurfaceArea / (binWidth * binHeight);
}